

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall icu_63::TextTrieMap::~TextTrieMap(TextTrieMap *this)

{
  UObjectDeleter *pUVar1;
  int32_t iVar2;
  void *pvVar3;
  int local_18;
  int local_14;
  int32_t i;
  int32_t index;
  TextTrieMap *this_local;
  
  this->_vptr_TextTrieMap = (_func_int **)&PTR__TextTrieMap_004ee9d0;
  for (local_14 = 0; local_14 < this->fNodesCount; local_14 = local_14 + 1) {
    CharacterNode::deleteValues(this->fNodes + local_14,this->fValueDeleter);
  }
  uprv_free_63(this->fNodes);
  if (this->fLazyContents != (UVector *)0x0) {
    for (local_18 = 0; iVar2 = UVector::size(this->fLazyContents), local_18 < iVar2;
        local_18 = local_18 + 2) {
      if (this->fValueDeleter != (UObjectDeleter *)0x0) {
        pUVar1 = this->fValueDeleter;
        pvVar3 = UVector::elementAt(this->fLazyContents,local_18 + 1);
        (*pUVar1)(pvVar3);
      }
    }
    if (this->fLazyContents != (UVector *)0x0) {
      (*(this->fLazyContents->super_UObject)._vptr_UObject[1])();
    }
  }
  return;
}

Assistant:

TextTrieMap::~TextTrieMap() {
    int32_t index;
    for (index = 0; index < fNodesCount; ++index) {
        fNodes[index].deleteValues(fValueDeleter);
    }
    uprv_free(fNodes);
    if (fLazyContents != NULL) {
        for (int32_t i=0; i<fLazyContents->size(); i+=2) {
            if (fValueDeleter) {
                fValueDeleter(fLazyContents->elementAt(i+1));
            }
        } 
        delete fLazyContents;
    }
}